

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O2

bool __thiscall spdlog::details::thread_pool::process_next_msg_(thread_pool *this)

{
  bool bVar1;
  bool bVar2;
  async_msg incoming_async_msg;
  async_msg aStack_1a8;
  
  async_msg::async_msg(&aStack_1a8);
  bVar1 = mpmc_blocking_queue<spdlog::details::async_msg>::dequeue_for
                    (&this->q_,&aStack_1a8,(milliseconds)0x2710);
  bVar2 = true;
  if (bVar1) {
    if (aStack_1a8.msg_type == terminate) {
      bVar2 = false;
    }
    else if (aStack_1a8.msg_type == flush) {
      async_logger::backend_flush_
                (aStack_1a8.worker_ptr.
                 super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    else if (aStack_1a8.msg_type == log) {
      async_logger::backend_sink_it_
                (aStack_1a8.worker_ptr.
                 super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (log_msg *)&aStack_1a8);
    }
  }
  async_msg::~async_msg(&aStack_1a8);
  return bVar2;
}

Assistant:

bool SPDLOG_INLINE thread_pool::process_next_msg_()
{
    async_msg incoming_async_msg;
    bool dequeued = q_.dequeue_for(incoming_async_msg, std::chrono::seconds(10));
    if (!dequeued)
    {
        return true;
    }

    switch (incoming_async_msg.msg_type)
    {
    case async_msg_type::log: {
        incoming_async_msg.worker_ptr->backend_sink_it_(incoming_async_msg);
        return true;
    }
    case async_msg_type::flush: {
        incoming_async_msg.worker_ptr->backend_flush_();
        return true;
    }

    case async_msg_type::terminate: {
        return false;
    }

    default: {
        assert(false && "Unexpected async_msg_type");
    }
    }

    return true;
}